

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation_with_magic_number.h
# Opt level: O2

void __thiscall
sptk::InputSourceInterpolationWithMagicNumber::~InputSourceInterpolationWithMagicNumber
          (InputSourceInterpolationWithMagicNumber *this)

{
  (this->super_InputSourceInterface)._vptr_InputSourceInterface =
       (_func_int **)&PTR__InputSourceInterpolationWithMagicNumber_00111cb0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->increment_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->next_data_).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->curr_data_).super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

~InputSourceInterpolationWithMagicNumber() override {
  }